

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

Set * skiwi::make_set(Set *__return_storage_ptr__,
                     vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  e_type eVar4;
  reference pvVar5;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *extraout_RDX;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *extraout_RDX_00;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_00;
  Expression local_1e8;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  token tok;
  string local_98;
  byte local_71;
  undefined1 local_70 [8];
  string name;
  allocator<char> local_39;
  string local_38;
  _anonymous_namespace_ *local_18;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_local;
  Set *s;
  
  local_18 = (_anonymous_namespace_ *)tokens;
  tokens_local = (vector<skiwi::token,_std::allocator<skiwi::token>_> *)__return_storage_ptr__;
  bVar3 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::empty(tokens);
  if (bVar3) {
    anon_unknown_2::throw_parse_error(no_tokens);
  }
  eVar4 = anon_unknown_2::current_type
                    ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  tokens_00 = extraout_RDX;
  if (eVar4 != T_ID) {
    pvVar5 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    iVar1 = pvVar5->line_nr;
    pvVar5 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    iVar2 = pvVar5->column_nr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
    anon_unknown_2::throw_parse_error(iVar1,iVar2,bad_syntax,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    tokens_00 = extraout_RDX_00;
  }
  (anonymous_namespace)::current_abi_cxx11_((string *)local_70,local_18,tokens_00);
  local_71 = 0;
  Set::Set(__return_storage_ptr__);
  pvVar5 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                     ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  __return_storage_ptr__->line_nr = pvVar5->line_nr;
  pvVar5 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                     ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  __return_storage_ptr__->column_nr = pvVar5->column_nr;
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_70,"set!");
  if (bVar3) {
    pvVar5 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    iVar1 = pvVar5->line_nr;
    pvVar5 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    iVar2 = pvVar5->column_nr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"set!",(allocator<char> *)((long)&tok.column_nr + 3));
    anon_unknown_2::throw_parse_error(iVar1,iVar2,expected_keyword,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&tok.column_nr + 3));
  }
  anon_unknown_2::advance((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  anon_unknown_2::take
            ((token *)local_d0,(vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  if (local_d0._0_4_ != T_ID) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
    anon_unknown_2::throw_parse_error
              (tok.value.field_2._8_4_,tok.value.field_2._12_4_,invalid_variable_name,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
  }
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&tok);
  make_expression(&local_1e8,(vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  std::
  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ::push_back(&__return_storage_ptr__->value,&local_1e8);
  std::
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  ::~variant(&local_1e8);
  local_71 = 1;
  token::~token((token *)local_d0);
  if ((local_71 & 1) == 0) {
    Set::~Set(__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_70);
  return __return_storage_ptr__;
}

Assistant:

Set make_set(std::vector<token>& tokens)
  {
  if (tokens.empty())
    throw_parse_error(no_tokens);
  if (current_type(tokens) != token::T_ID)
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, bad_syntax);
  std::string name = current(tokens);
  Set s;
  s.line_nr = tokens.back().line_nr;
  s.column_nr = tokens.back().column_nr;
  if (name != "set!")
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, expected_keyword, "set!");
  advance(tokens);
  auto tok = take(tokens);
  if (tok.type != token::T_ID)
    throw_parse_error(tok.line_nr, tok.column_nr, invalid_variable_name);
  s.name = tok.value;
  s.value.push_back(make_expression(tokens));
  return s;
  }